

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O3

int __thiscall QtMWidgets::StepperPrivate::init(StepperPrivate *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  int iVar2;
  long *plVar3;
  QTimer *this_00;
  QStyleOption opt;
  QStyleOption local_50 [40];
  undefined1 local_28 [24];
  
  QStyleOption::QStyleOption(local_50,1,0);
  QStyleOption::initFrom((QWidget *)local_50);
  plVar3 = (long *)QPalette::brush((ColorGroup)local_28,Dark);
  uVar1 = *(undefined8 *)(*plVar3 + 8);
  *(undefined8 *)((long)&(this->color).ct + 2) = *(undefined8 *)(*plVar3 + 0xe);
  *(undefined8 *)&this->color = uVar1;
  this_00 = (QTimer *)operator_new(0x10);
  QTimer::QTimer(this_00,(QObject *)this->q);
  this->timer = this_00;
  iVar2 = QStyleOption::~QStyleOption(local_50);
  return iVar2;
}

Assistant:

void
StepperPrivate::init()
{
	QStyleOption opt;
	opt.initFrom( q );

	color = opt.palette.color( QPalette::Highlight );

	timer = new QTimer( q );
}